

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  void *__s_00;
  ulong local_80;
  size_t i;
  uchar *opad;
  uchar *ipad;
  uchar sum [64];
  size_t keylen_local;
  uchar *key_local;
  mbedtls_md_context_t *ctx_local;
  
  if (((ctx == (mbedtls_md_context_t *)0x0) || (ctx->md_info == (mbedtls_md_info_t *)0x0)) ||
     (ctx->hmac_ctx == (void *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    sum._56_8_ = keylen;
    keylen_local = (size_t)key;
    if ((ulong)(long)ctx->md_info->block_size < keylen) {
      (*ctx->md_info->starts_func)(ctx->md_ctx);
      (*ctx->md_info->update_func)(ctx->md_ctx,key,sum._56_8_);
      (*ctx->md_info->finish_func)(ctx->md_ctx,(uchar *)&ipad);
      sum._56_8_ = SEXT48(ctx->md_info->size);
      keylen_local = (size_t)&ipad;
    }
    __s = (uchar *)ctx->hmac_ctx;
    __s_00 = (void *)((long)ctx->hmac_ctx + (long)ctx->md_info->block_size);
    memset(__s,0x36,(long)ctx->md_info->block_size);
    memset(__s_00,0x5c,(long)ctx->md_info->block_size);
    for (local_80 = 0; local_80 < (ulong)sum._56_8_; local_80 = local_80 + 1) {
      __s[local_80] = __s[local_80] ^ *(byte *)(keylen_local + local_80);
      *(byte *)((long)__s_00 + local_80) =
           *(byte *)((long)__s_00 + local_80) ^ *(byte *)(keylen_local + local_80);
    }
    mbedtls_zeroize(&ipad,0x40);
    (*ctx->md_info->starts_func)(ctx->md_ctx);
    (*ctx->md_info->update_func)(ctx->md_ctx,__s,(long)ctx->md_info->block_size);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_hmac_starts( mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen )
{
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;
    size_t i;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( keylen > (size_t) ctx->md_info->block_size )
    {
        ctx->md_info->starts_func( ctx->md_ctx );
        ctx->md_info->update_func( ctx->md_ctx, key, keylen );
        ctx->md_info->finish_func( ctx->md_ctx, sum );

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset( ipad, 0x36, ctx->md_info->block_size );
    memset( opad, 0x5C, ctx->md_info->block_size );

    for( i = 0; i < keylen; i++ )
    {
        ipad[i] = (unsigned char)( ipad[i] ^ key[i] );
        opad[i] = (unsigned char)( opad[i] ^ key[i] );
    }

    mbedtls_zeroize( sum, sizeof( sum ) );

    ctx->md_info->starts_func( ctx->md_ctx );
    ctx->md_info->update_func( ctx->md_ctx, ipad, ctx->md_info->block_size );

    return( 0 );
}